

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void free_exporter_master_secret(ptls_t *tls,int is_early)

{
  void *__ptr;
  
  __ptr = *(void **)(tls->client_random + (ulong)(is_early == 0) * 8 + 0x28);
  if (__ptr == (void *)0x0) {
    return;
  }
  if (tls->key_schedule != (ptls_key_schedule_t *)0x0) {
    (*ptls_clear_memory)(__ptr,(tls->key_schedule->hashes[0].algo)->digest_size);
    free(__ptr);
    return;
  }
  __assert_fail("tls->key_schedule != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x424,"void free_exporter_master_secret(ptls_t *, int)");
}

Assistant:

static void free_exporter_master_secret(ptls_t *tls, int is_early)
{
    uint8_t *slot = is_early ? tls->exporter_master_secret.early : tls->exporter_master_secret.one_rtt;
    if (slot == NULL)
        return;
    assert(tls->key_schedule != NULL);
    ptls_clear_memory(slot, tls->key_schedule->hashes[0].algo->digest_size);
    free(slot);
}